

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

JointIndex __thiscall iDynTree::Model::getJointIndex(Model *this,string *jointName)

{
  JointIndex JVar1;
  __type _Var2;
  ostream *poVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  stringstream ss;
  char *local_1c8 [4];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    if ((ulong)((long)(this->joints).
                      super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->joints).
                      super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar5) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar3 = std::operator<<(local_198,"jointName ");
      poVar3 = std::operator<<(poVar3,(string *)jointName);
      std::operator<<(poVar3," not found in the model.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("Model","getJointIndex",local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      JVar1 = JOINT_INVALID_INDEX;
      std::__cxx11::stringstream::~stringstream(local_1a8);
      return JVar1;
    }
    _Var2 = std::operator==(jointName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((this->jointNames).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar4));
    if (_Var2) break;
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x20;
  }
  return uVar5;
}

Assistant:

JointIndex Model::getJointIndex(const std::string& jointName) const
{
    for(size_t i=0; i < this->getNrOfJoints(); i++ )
    {
        if( jointName == jointNames[i] )
        {
            return i;
        }
    }

    std::stringstream ss;
    ss << "jointName " << jointName << " not found in the model.";
    reportError("Model","getJointIndex",ss.str().c_str());

    return JOINT_INVALID_INDEX;
}